

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pragmaVtabBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  int local_40 [2];
  int seen [2];
  int j;
  int i;
  sqlite3_index_constraint *pConstraint;
  PragmaVtab *pTab;
  sqlite3_index_info *pIdxInfo_local;
  sqlite3_vtab *tab_local;
  
  pIdxInfo->estimatedCost = 1.0;
  if (*(char *)&tab[1].zErrMsg != '\0') {
    _j = pIdxInfo->aConstraint;
    local_40[0] = 0;
    local_40[1] = 0;
    for (seen[1] = 0; seen[1] < pIdxInfo->nConstraint; seen[1] = seen[1] + 1) {
      if (((int)(uint)*(byte *)((long)&tab[1].zErrMsg + 1) <= _j->iColumn) && (_j->op == '\x02')) {
        if (_j->usable == '\0') {
          return 0x13;
        }
        local_40[(int)(_j->iColumn - (uint)*(byte *)((long)&tab[1].zErrMsg + 1))] = seen[1] + 1;
      }
      _j = _j + 1;
    }
    if (local_40[0] == 0) {
      pIdxInfo->estimatedCost = 2147483647.0;
      pIdxInfo->estimatedRows = 0x7fffffff;
    }
    else {
      pIdxInfo->aConstraintUsage[local_40[0] + -1].argvIndex = 1;
      pIdxInfo->aConstraintUsage[local_40[0] + -1].omit = '\x01';
      pIdxInfo->estimatedCost = 20.0;
      pIdxInfo->estimatedRows = 0x14;
      if (local_40[1] != 0) {
        pIdxInfo->aConstraintUsage[local_40[1] + -1].argvIndex = 2;
        pIdxInfo->aConstraintUsage[local_40[1] + -1].omit = '\x01';
      }
    }
  }
  return 0;
}

Assistant:

static int pragmaVtabBestIndex(sqlite3_vtab *tab, sqlite3_index_info *pIdxInfo){
  PragmaVtab *pTab = (PragmaVtab*)tab;
  const struct sqlite3_index_constraint *pConstraint;
  int i, j;
  int seen[2];

  pIdxInfo->estimatedCost = (double)1;
  if( pTab->nHidden==0 ){ return SQLITE_OK; }
  pConstraint = pIdxInfo->aConstraint;
  seen[0] = 0;
  seen[1] = 0;
  for(i=0; i<pIdxInfo->nConstraint; i++, pConstraint++){
    if( pConstraint->iColumn < pTab->iHidden ) continue;
    if( pConstraint->op!=SQLITE_INDEX_CONSTRAINT_EQ ) continue;
    if( pConstraint->usable==0 ) return SQLITE_CONSTRAINT;
    j = pConstraint->iColumn - pTab->iHidden;
    assert( j < 2 );
    seen[j] = i+1;
  }
  if( seen[0]==0 ){
    pIdxInfo->estimatedCost = (double)2147483647;
    pIdxInfo->estimatedRows = 2147483647;
    return SQLITE_OK;
  }
  j = seen[0]-1;
  pIdxInfo->aConstraintUsage[j].argvIndex = 1;
  pIdxInfo->aConstraintUsage[j].omit = 1;
  pIdxInfo->estimatedCost = (double)20;
  pIdxInfo->estimatedRows = 20;
  if( seen[1] ){
    j = seen[1]-1;
    pIdxInfo->aConstraintUsage[j].argvIndex = 2;
    pIdxInfo->aConstraintUsage[j].omit = 1;
  }
  return SQLITE_OK;
}